

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZVec<long> *in_stack_ffffffffffffff78;
  TPZTriangleTorus *in_stack_ffffffffffffff80;
  TPZGeoEl *pTVar1;
  int64_t *local_78;
  TPZGeoElSideIndex local_58;
  int local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZTriangleTorus>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245f790);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  pzgeom::TPZTriangleTorus::TPZTriangleTorus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_78 = (int64_t *)&in_RDI[7].fMatId;
  pTVar1 = in_RDI + 10;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_78 = local_78 + 3;
  } while ((TPZGeoEl *)local_78 != pTVar1);
  for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[7].fMatId + (long)local_40 * 6),&local_58);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1726ed8);
  }
  pzgeom::TPZNodeRep<3,_pztopology::TPZTriangle>::Initialize
            ((TPZNodeRep<3,_pztopology::TPZTriangle> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}